

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O0

SUNErrCode SUNQRAdd_ICWY_SB(N_Vector *Q,sunrealtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  int in_ECX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  N_Vector in_R9;
  SUNQRData qrdata;
  sunindextype k;
  sunindextype j;
  SUNContext sunctx_local_scope_;
  N_Vector in_stack_ffffffffffffffa8;
  N_Vector in_stack_ffffffffffffffb0;
  double c;
  N_Vector *in_stack_ffffffffffffffc0;
  long lVar1;
  sunrealtype sVar2;
  N_Vector in_stack_ffffffffffffffc8;
  sunrealtype sVar3;
  int nvec;
  
  nvec = (int)((ulong)*(undefined8 *)(*in_RDI + 0x10) >> 0x20);
  N_VScale((sunrealtype)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(N_Vector)0x10b926);
  if (0 < in_ECX) {
    N_VDotProdMultiLocal
              (nvec,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(sunrealtype *)in_R9);
    N_VDotProdMultiLocal
              (nvec,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(sunrealtype *)in_R9);
    N_VDotProdMultiAllReduce
              ((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),in_R9,
               (sunrealtype *)in_stack_ffffffffffffffb0);
    for (lVar1 = 0; lVar1 < in_ECX; lVar1 = lVar1 + 1) {
      *(SUNProfiler *)(in_RSI + (in_ECX * in_R8D + lVar1) * 8) =
           (&in_R9->sunctx->profiler)[((in_ECX + -1) * in_R8D + in_ECX) + lVar1];
    }
    (&in_R9->sunctx->profiler)[(in_ECX + -1) * in_R8D + in_ECX + -1] =
         (SUNProfiler)0x3ff0000000000000;
    for (sVar2 = 0.0; sVar3 = sVar2, (long)sVar2 < (long)in_ECX;
        sVar2 = (sunrealtype)((long)sVar2 + 1)) {
      while (sVar3 = (sunrealtype)((long)sVar3 + 1), (long)sVar3 < (long)in_ECX) {
        lVar1 = (long)(in_ECX * in_R8D) + (long)sVar3;
        *(double *)(in_RSI + lVar1 * 8) =
             -*(double *)(in_RSI + ((long)(in_ECX * in_R8D) + (long)sVar2) * 8) *
             (double)(&in_R9->sunctx->profiler)[(long)sVar3 * (long)in_R8D + (long)sVar2] +
             *(double *)(in_RSI + lVar1 * 8);
      }
    }
    N_VLinearCombination
              ((int)((ulong)sVar2 >> 0x20),(sunrealtype *)in_R9,
               (N_Vector *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    N_VLinearSum(sVar2,in_R9,(sunrealtype)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                 (N_Vector)0x10bbb6);
  }
  sVar2 = N_VDotProd(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *(sunrealtype *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8) = sVar2;
  if (0.0 < *(double *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8)) {
    c = sqrt(*(double *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8));
  }
  else {
    c = 0.0;
  }
  *(double *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8) = c;
  N_VScale(c,in_stack_ffffffffffffffa8,(N_Vector)0x10bc91);
  return 0;
}

Assistant:

SUNErrCode SUNQRAdd_ICWY_SB(N_Vector* Q, sunrealtype* R, N_Vector df, int m,
                            int mMax, void* QRdata)
{
  SUNFunctionBegin(Q[0]->sunctx);
  sunindextype j, k;
  SUNQRData qrdata = (SUNQRData)QRdata;

  N_VScale(ONE, df, qrdata->vtemp);
  SUNCheckLastErr(); /* stores d_fi in temp */

  if (m > 0)
  {
    /* T(1:k-1,k-1)^T = Q(:,1:k-1)^T * Q(:,k-1) */
    SUNCheckCall(N_VDotProdMultiLocal(m, Q[m - 1], Q,
                                      qrdata->temp_array + (m - 1) * mMax));

    /* R(1:k-1,k) = Q_k-1^T * df */
    /* Put R values at end of temp_array */
    SUNCheckCall(N_VDotProdMultiLocal(m, qrdata->vtemp, Q,
                                      qrdata->temp_array + (m - 1) * mMax + m));

    SUNCheckCall(N_VDotProdMultiAllReduce(m + m, qrdata->vtemp,
                                          qrdata->temp_array + (m - 1) * mMax));

    /* Move the last values from temp array into R */
    for (k = 0; k < m; k++)
    {
      R[m * mMax + k] = qrdata->temp_array[(m - 1) * mMax + m + k];
    }

    /* T(k-1,k-1) = 1.0 */
    qrdata->temp_array[(m - 1) * mMax + (m - 1)] = ONE;

    /* Solve T^T * R(1:k-1,k) = R(1:k-1,k) */
    for (k = 0; k < m; k++)
    {
      /* Skip setting the diagonal element because it doesn't change */
      for (j = k + 1; j < m; j++)
      {
        R[m * mMax + j] -= R[m * mMax + k] * qrdata->temp_array[j * mMax + k];
      }
    }
    /* end */

    /* Q(:,k-1) = df - Q_k-1 R(1:k-1,k) */
    SUNCheckCall(N_VLinearCombination(m, R + m * mMax, Q, qrdata->vtemp2));
    N_VLinearSum(ONE, qrdata->vtemp, -ONE, qrdata->vtemp2, qrdata->vtemp);
    SUNCheckLastErr();
  }

  /* R(k,k) = \| df \| */
  R[m * mMax + m] = N_VDotProd(qrdata->vtemp, qrdata->vtemp);
  SUNCheckLastErr();
  R[m * mMax + m] = SUNRsqrt(R[m * mMax + m]);
  /* Q(:,k) = df / \| df \| */
  N_VScale((1 / R[m * mMax + m]), qrdata->vtemp, Q[m]);
  SUNCheckLastErr();

  return SUN_SUCCESS;
}